

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  byte *pbVar9;
  byte *p;
  long in_FS_OFFSET;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = this->data_;
  pcVar5 = (this->value_).data_ + ((this->value_).size_ - (long)pcVar2);
  uVar4 = (uint)pcVar5;
  this->current_ = uVar4;
  uVar6 = this->restarts_;
  if (uVar4 < uVar6) {
    uVar7 = (ulong)pcVar5 & 0xffffffff;
    if (2 < (long)(uVar6 - uVar7)) {
      limit = (byte *)(pcVar2 + uVar6);
      pbVar9 = (byte *)(pcVar2 + uVar7);
      bVar1 = *pbVar9;
      local_24 = (uint)bVar1;
      local_28 = (uint)pbVar9[1];
      local_2c = (uint)pbVar9[2];
      if ((byte)(pbVar9[1] | bVar1 | pbVar9[2]) < 0x80) {
        pbVar9 = pbVar9 + 3;
      }
      else {
        if (uVar4 < uVar6 && -1 < (char)bVar1) {
          pbVar9 = pbVar9 + 1;
        }
        else {
          pbVar9 = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_24);
          if (pbVar9 == (byte *)0x0) goto LAB_0067eba8;
        }
        if ((pbVar9 < limit) && (-1 < (char)*pbVar9)) {
          p = pbVar9 + 1;
          local_28 = (int)(char)*pbVar9;
        }
        else {
          p = (byte *)GetVarint32PtrFallback((char *)pbVar9,(char *)limit,&local_28);
          if (p == (byte *)0x0) goto LAB_0067eba8;
        }
        if ((p < limit) && (-1 < (char)*p)) {
          pbVar9 = p + 1;
          local_2c = (int)(char)*p;
        }
        else {
          pbVar9 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_2c);
          if (pbVar9 == (byte *)0x0) goto LAB_0067eba8;
        }
      }
      if ((local_2c + local_28 <= (uint)((int)limit - (int)pbVar9)) &&
         ((ulong)local_24 <= (this->key_)._M_string_length)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (&this->key_,(ulong)local_24,'\0');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&this->key_,(char *)pbVar9,(ulong)local_28);
        (this->value_).data_ = (char *)(pbVar9 + local_28);
        (this->value_).size_ = (ulong)local_2c;
        uVar6 = this->restart_index_ + 1;
        bVar3 = true;
        if (uVar6 < this->num_restarts_) {
          puVar8 = (uint *)(this->data_ + (ulong)this->restarts_ + (ulong)uVar6 * 4);
          do {
            if (this->current_ <= *puVar8) break;
            this->restart_index_ = uVar6;
            uVar6 = uVar6 + 1;
            puVar8 = puVar8 + 1;
          } while (this->num_restarts_ != uVar6);
        }
        goto LAB_0067ebb2;
      }
    }
LAB_0067eba8:
    CorruptionError(this);
  }
  else {
    this->current_ = uVar6;
    this->restart_index_ = this->num_restarts_;
  }
  bVar3 = false;
LAB_0067ebb2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool ParseNextKey() {
    current_ = NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }